

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.cpp
# Opt level: O0

void duckdb_skiplistlib::skip_list::_throw_exceeds_size(size_t param_1)

{
  IndexError *this;
  string err_msg;
  string *in_stack_ffffffffffffffa8;
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"Index out of range.",&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  this = (IndexError *)__cxa_allocate_exception(0x28);
  IndexError::IndexError(this,in_stack_ffffffffffffffa8);
  __cxa_throw(this,&IndexError::typeinfo,IndexError::~IndexError);
}

Assistant:

void _throw_exceeds_size(size_t /* index */) {
    std::string err_msg = "Index out of range.";
#endif
    throw IndexError(err_msg);
}